

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.cpp
# Opt level: O3

void __thiscall
antlr::CharScanner::CharScanner(CharScanner *this,LexerSharedInputState *state,bool case_sensitive)

{
  _Rb_tree_header *p_Var1;
  Ref *pRVar2;
  
  (this->super_TokenStream)._vptr_TokenStream = (_func_int **)&PTR___cxa_pure_virtual_002f5fc8;
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  (this->text)._M_string_length = 0;
  (this->text).field_2._M_local_buf[0] = '\0';
  this->saveConsumedInput = true;
  this->caseSensitive = case_sensitive;
  (this->literals)._M_t._M_impl.super__Rb_tree_key_compare<antlr::CharScannerLiteralsLess>.
  _M_key_compare.scanner = this;
  p_Var1 = &(this->literals)._M_t._M_impl.super__Rb_tree_header;
  (this->literals)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->literals)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->literals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->literals)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->literals)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_returnToken).ref = (TokenRef *)0x0;
  pRVar2 = state->ref;
  if (pRVar2 != (Ref *)0x0) {
    pRVar2->count = pRVar2->count + 1;
  }
  (this->inputState).ref = pRVar2;
  this->commitToPath = false;
  this->tabsize = 8;
  this->traceDepth = 0;
  this->tokenFactory = CommonToken::factory;
  return;
}

Assistant:

CharScanner::CharScanner( const LexerSharedInputState& state, bool case_sensitive )
	: saveConsumedInput(true) //, caseSensitiveLiterals(true)
	, caseSensitive(case_sensitive)
	, literals(CharScannerLiteralsLess(this))
	, inputState(state)
	, commitToPath(false)
	, tabsize(8)
	, traceDepth(0)
{
	setTokenObjectFactory(&CommonToken::factory);
}